

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O3

uint32 prune_lowcnt(dtree_node_t *node,float32 cnt_thr)

{
  float32 *pfVar1;
  dtree_node_t *node_00;
  uint32 uVar2;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    node_00 = node->y;
    if ((node_00 == (dtree_node_t *)0x0) && (node->n == (dtree_node_str *)0x0)) {
      uVar2 = 0;
      goto LAB_0010cad5;
    }
    if (((float)node_00->occ <= (float)cnt_thr && (float)cnt_thr != (float)node_00->occ) ||
       (pfVar1 = &node->n->occ, (float)*pfVar1 <= (float)cnt_thr && (float)cnt_thr != (float)*pfVar1
       )) break;
    uVar2 = prune_lowcnt(node_00,cnt_thr);
    node = node->n;
    iVar3 = iVar3 + uVar2;
  }
  uVar2 = prune_subtrees(node);
LAB_0010cad5:
  return uVar2 + iVar3;
}

Assistant:

uint32
prune_lowcnt(dtree_node_t *node, float32 cnt_thr)
{
    if (!IS_LEAF(node)) {
	/* Not a leaf node */
	if ((node->y->occ < cnt_thr) ||
	    (node->n->occ < cnt_thr)) {
	    return prune_subtrees(node);
	}
	else {
	    return
		prune_lowcnt(node->y, cnt_thr) + prune_lowcnt(node->n, cnt_thr);
	}
    }
    else {
	return 0;
    }
}